

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,Value *value,bool decl)

{
  double v;
  ValueKind VVar1;
  uint uVar2;
  Argument *this_00;
  AllocaInst *alloca;
  BasicBlock *bb;
  BranchInst *br;
  AtomicCmpXchgInst *xchg;
  CallInst *call;
  ShuffleVectorInst *shuf;
  AtomicRMWInst *atomic_op;
  GetElementPtrInst *ptr;
  ExtractElementInst *extr;
  ConstantDataArray *arr;
  LoggingCallback p_Var3;
  void *pvVar4;
  ReturnInst *value_00;
  Function *func;
  ConstantDataVector *vec;
  PHINode *phi;
  CastInst *cast;
  Value *pVVar5;
  Constant *this_01;
  APFloat *this_02;
  BinaryOperator *binop;
  UnaryOperator *uop;
  ExtractValueInst *ext;
  GlobalVariable *var;
  SwitchInst *branch;
  char buffer [4096];
  Type *local_1028;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4075];
  
  VVar1 = Value::get_value_kind(value);
  switch(VVar1) {
  case Argument:
    this_00 = (Argument *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this_00);
    if (VVar1 == Argument) {
      uVar2 = Argument::getArgNo(this_00);
      local_1028 = (Type *)CONCAT44(local_1028._4_4_,uVar2);
      append<char_const(&)[5],unsigned_int>(this,(char (*) [5])"%arg",(uint *)&local_1028);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Function:
    func = (Function *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)func);
    if (VVar1 == Function) {
      append(this,func,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  default:
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append((StreamState *)value);
    }
    else {
      VVar1 = Value::get_value_kind(value);
      snprintf((char *)&local_1028,0x1000,"Unknown ValueKind %u.\n",(ulong)VVar1);
      pvVar4 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,(char *)&local_1028);
    }
    if (decl) {
      local_1028 = (Type *)Value::get_tween_id(value);
      append<char_const(&)[2],unsigned_long,char_const(&)[17]>
                (this,(char (*) [2])0x1c4942,(unsigned_long *)&local_1028,
                 (char (*) [17])" = unimplemented");
      return;
    }
    local_1028 = (Type *)Value::get_tween_id(value);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4942,(unsigned_long *)&local_1028)
    ;
    return;
  case ConstantInt:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == ConstantInt) {
      append(this,(ConstantInt *)pVVar5,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ConstantFP:
    this_01 = (Constant *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this_01);
    if (VVar1 == ConstantFP) {
      this_02 = Constant::getValueAPF(this_01);
      v = APFloat::convertToDouble(this_02);
      append(this,v);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ConstantAggregateZero:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == ConstantAggregateZero) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[zeroinitialized]",0x11);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ConstantDataArray:
    arr = (ConstantDataArray *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)arr);
    if (VVar1 == ConstantDataArray) {
      append(this,arr,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ConstantDataVector:
    vec = (ConstantDataVector *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)vec);
    if (VVar1 == ConstantDataVector) {
      append(this,vec,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Undef:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == Undef) {
      local_1028 = Value::getType(pVVar5);
      append<LLVMBC::Type*,char_const(&)[7]>(this,&local_1028,(char (*) [7])" undef");
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case UnaryOperator:
    uop = (UnaryOperator *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)uop);
    if (VVar1 == UnaryOperator) {
      append(this,uop,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case BinaryOperator:
    binop = (BinaryOperator *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)binop);
    if (VVar1 == BinaryOperator) {
      append(this,binop,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Call:
    call = (CallInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)call);
    if (VVar1 == Call) {
      append(this,call,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case FCmp:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == FCmp) {
      append(this,(FCmpInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ICmp:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == ICmp) {
      append(this,(ICmpInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case BasicBlock:
    bb = (BasicBlock *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)bb);
    if (VVar1 == BasicBlock) {
      append(this,bb,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case PHI:
    phi = (PHINode *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)phi);
    if (VVar1 == PHI) {
      append(this,phi,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Cast:
    cast = (CastInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)cast);
    if (VVar1 == Cast) {
      append(this,cast,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Select:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == Select) {
      append(this,(SelectInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ExtractValue:
    ext = (ExtractValueInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)ext);
    if (VVar1 == ExtractValue) {
      append(this,ext,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Alloca:
    alloca = (AllocaInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)alloca);
    if (VVar1 == Alloca) {
      append(this,alloca,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case GetElementPtr:
    ptr = (GetElementPtrInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)ptr);
    if (VVar1 == GetElementPtr) {
      append(this,ptr,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Load:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == Load) {
      append(this,(LoadInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Store:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == Store) {
      append(this,(StoreInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case AtomicRMW:
    atomic_op = (AtomicRMWInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)atomic_op);
    if (VVar1 == AtomicRMW) {
      append(this,atomic_op,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case AtomicCmpXchg:
    xchg = (AtomicCmpXchgInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)xchg);
    if (VVar1 == AtomicCmpXchg) {
      append(this,xchg,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Return:
    value_00 = (ReturnInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)value_00);
    if (VVar1 == Return) {
      append(this,value_00,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Branch:
    br = (BranchInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)br);
    if (VVar1 == Branch) {
      append(this,br,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Switch:
    branch = (SwitchInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)branch);
    if (VVar1 == Switch) {
      append(this,branch,false);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case Global:
    var = (GlobalVariable *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)var);
    if (VVar1 == Global) {
      append(this,var,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ShuffleVector:
    shuf = (ShuffleVectorInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)shuf);
    if (VVar1 == ShuffleVector) {
      append(this,shuf,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case ExtractElement:
    extr = (ExtractElementInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)extr);
    if (VVar1 == ExtractElement) {
      append(this,extr,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
    break;
  case InsertElement:
    pVVar5 = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(pVVar5);
    if (VVar1 == InsertElement) {
      append(this,(InsertElementInst *)pVVar5,decl);
      return;
    }
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      append();
      std::terminate();
    }
  }
  uStack_1018 = 0x6163206e69;
  builtin_strncpy(acStack_1013,"st<T>.\n",8);
  local_1028 = (Type *)0x2064696c61766e49;
  uStack_1020 = 0x2065707974;
  uStack_101b = 0x204449;
  pvVar4 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var3)(pvVar4,Error,(char *)&local_1028);
  std::terminate();
}

Assistant:

void StreamState::append(Value *value, bool decl)
{
	switch (value->get_value_kind())
	{
	case ValueKind::Argument:
		return append(cast<Argument>(value), decl);
	case ValueKind::Function:
		return append(cast<Function>(value), decl);
	case ValueKind::BinaryOperator:
		return append(cast<BinaryOperator>(value), decl);
	case ValueKind::UnaryOperator:
		return append(cast<UnaryOperator>(value), decl);
	case ValueKind::Call:
		return append(cast<CallInst>(value), decl);
	case ValueKind::Branch:
		return append(cast<BranchInst>(value), decl);
	case ValueKind::FCmp:
		return append(cast<FCmpInst>(value), decl);
	case ValueKind::ICmp:
		return append(cast<ICmpInst>(value), decl);
	case ValueKind::Return:
		return append(cast<ReturnInst>(value), decl);
	case ValueKind::Undef:
		return append(cast<UndefValue>(value), decl);
	case ValueKind::ConstantInt:
		return append(cast<ConstantInt>(value), decl);
	case ValueKind::ConstantFP:
		return append(cast<ConstantFP>(value), decl);
	case ValueKind::BasicBlock:
		return append(cast<BasicBlock>(value), decl);
	case ValueKind::PHI:
		return append(cast<PHINode>(value), decl);
	case ValueKind::Cast:
		return append(cast<CastInst>(value), decl);
	case ValueKind::Select:
		return append(cast<SelectInst>(value), decl);
	case ValueKind::ExtractValue:
		return append(cast<ExtractValueInst>(value), decl);
	case ValueKind::Alloca:
		return append(cast<AllocaInst>(value), decl);
	case ValueKind::GetElementPtr:
		return append(cast<GetElementPtrInst>(value), decl);
	case ValueKind::Load:
		return append(cast<LoadInst>(value), decl);
	case ValueKind::Store:
		return append(cast<StoreInst>(value), decl);
	case ValueKind::AtomicRMW:
		return append(cast<AtomicRMWInst>(value), decl);
	case ValueKind::AtomicCmpXchg:
		return append(cast<AtomicCmpXchgInst>(value), decl);
	case ValueKind::Global:
		return append(cast<GlobalVariable>(value), decl);
	case ValueKind::ConstantAggregateZero:
		return append(cast<ConstantAggregateZero>(value), decl);
	case ValueKind::ConstantDataArray:
		return append(cast<ConstantDataArray>(value), decl);
	case ValueKind::ConstantDataVector:
		return append(cast<ConstantDataVector>(value), decl);
	case ValueKind::Switch:
		return append(cast<SwitchInst>(value), decl);
	case ValueKind::ShuffleVector:
		return append(cast<ShuffleVectorInst>(value), decl);
	case ValueKind::ExtractElement:
		return append(cast<ExtractElementInst>(value), decl);
	case ValueKind::InsertElement:
		return append(cast<InsertElementInst>(value), decl);
	default:
		break;
	}

	LOGE("Unknown ValueKind %u.\n", unsigned(value->get_value_kind()));

	if (decl)
		append("%", value->get_tween_id(), " = unimplemented");
	else
		append("%", value->get_tween_id());
}